

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndGroup(void)

{
  ImVector<ImGuiGroupData> *this;
  ImVec2 *lhs;
  float fVar1;
  float fVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  char cVar8;
  ImGuiGroupData *rhs;
  ImGuiItemStatusFlags *pIVar9;
  ImGuiContext *g;
  bool bVar10;
  uint uVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImRect group_bb;
  ImRect local_58;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if ((pIVar4->DC).GroupStack.Size == 0) {
    __assert_fail("!window->DC.GroupStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1c83,"void ImGui::EndGroup()");
  }
  this = &(pIVar4->DC).GroupStack;
  rhs = ImVector<ImGuiGroupData>::back(this);
  lhs = &(pIVar4->DC).CursorMaxPos;
  local_58.Max = ImMax(lhs,&rhs->BackupCursorPos);
  IVar5 = rhs->BackupCursorPos;
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_4_ = local_58.Max.x;
  local_48._4_4_ = local_58.Max.y;
  local_48._12_4_ = extraout_XMM0_Dd;
  (pIVar4->DC).CursorPos = IVar5;
  local_58.Min = IVar5;
  IVar6 = ImMax(&rhs->BackupCursorMaxPos,lhs);
  (pIVar4->DC).CursorMaxPos = IVar6;
  (pIVar4->DC).Indent.x = (rhs->BackupIndent).x;
  (pIVar4->DC).GroupOffset.x = (rhs->BackupGroupOffset).x;
  (pIVar4->DC).CurrLineSize = rhs->BackupCurrLineSize;
  fVar1 = rhs->BackupCurrLineTextBaseOffset;
  (pIVar4->DC).CurrLineTextBaseOffset = fVar1;
  if (pIVar7->LogEnabled == true) {
    pIVar7->LogLinePosY = -3.4028235e+38;
  }
  if (rhs->EmitItem == false) {
    ImVector<ImGuiGroupData>::pop_back(this);
    return;
  }
  fVar2 = (pIVar4->DC).PrevLineTextBaseOffset;
  uVar11 = -(uint)(fVar1 <= fVar2);
  (pIVar4->DC).CurrLineTextBaseOffset = (float)(~uVar11 & (uint)fVar1 | (uint)fVar2 & uVar11);
  local_38.y = (float)local_48._4_4_ - IVar5.y;
  local_38.x = (float)local_48._0_4_ - IVar5.x;
  ItemSize(&local_38,-1.0);
  ItemAdd(&local_58,0,(ImRect *)0x0);
  IVar3 = pIVar7->ActiveId;
  if (rhs->BackupActiveIdIsAlive == IVar3) {
    if (rhs->BackupActiveIdPreviousFrameIsAlive == false) {
      cVar8 = pIVar7->ActiveIdPreviousFrameIsAlive;
joined_r0x00154d7d:
      if (cVar8 == '\0') goto LAB_00154d83;
      (pIVar4->DC).LastItemId = pIVar7->ActiveIdPreviousFrame;
      cVar8 = '\x01';
    }
    else {
LAB_00154d83:
      cVar8 = '\0';
    }
LAB_00154d85:
    (pIVar4->DC).LastItemRect.Min = local_58.Min;
    (pIVar4->DC).LastItemRect.Max = local_58.Max;
    uVar11 = (pIVar4->DC).LastItemStatusFlags;
    (pIVar4->DC).LastItemStatusFlags = uVar11 | 0x20;
joined_r0x00154deb:
    if (cVar8 == '\0') goto LAB_00154dc9;
  }
  else {
    bVar10 = pIVar7->ActiveIdIsAlive != IVar3;
    if (rhs->BackupActiveIdPreviousFrameIsAlive == false) {
      cVar8 = pIVar7->ActiveIdPreviousFrameIsAlive;
      if (IVar3 == 0 || bVar10) goto joined_r0x00154d7d;
    }
    else {
      cVar8 = '\0';
      if (IVar3 == 0 || bVar10) goto LAB_00154d85;
    }
    (pIVar4->DC).LastItemId = IVar3;
    (pIVar4->DC).LastItemRect.Min = local_58.Min;
    (pIVar4->DC).LastItemRect.Max = local_58.Max;
    uVar11 = (pIVar4->DC).LastItemStatusFlags;
    pIVar9 = &(pIVar4->DC).LastItemStatusFlags;
    if (pIVar7->ActiveIdHasBeenEditedThisFrame != true) {
      *pIVar9 = uVar11 | 0x20;
      goto joined_r0x00154deb;
    }
    *pIVar9 = uVar11 | 0x24;
    if (cVar8 == '\0') goto LAB_00154dc9;
    uVar11 = uVar11 | 4;
  }
  if (pIVar7->ActiveId != pIVar7->ActiveIdPreviousFrame) {
    (pIVar4->DC).LastItemStatusFlags = uVar11 | 0x60;
  }
LAB_00154dc9:
  ImVector<ImGuiGroupData>::pop_back(this);
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(!window->DC.GroupStack.empty());  // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce Log carriage return

    if (!group_data.EmitItem)
    {
        window->DC.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The tests not symmetrical because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = !group_data.BackupActiveIdPreviousFrameIsAlive && g.ActiveIdPreviousFrameIsAlive;
    if (group_contains_curr_active_id)
        window->DC.LastItemId = g.ActiveId;
    else if (group_contains_prev_active_id)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Deactivated;

    window->DC.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}